

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int is_directed_automorphism(saucy *s)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int j;
  int i;
  saucy *s_local;
  
  local_1c = 0;
  while( true ) {
    if (s->ndiffs <= local_1c) {
      return 1;
    }
    iVar2 = s->unsupp[local_1c];
    iVar1 = check_mapping(s,s->adj,s->edg,iVar2);
    if (iVar1 == 0) break;
    iVar2 = check_mapping(s,s->dadj,s->dedg,iVar2);
    if (iVar2 == 0) {
      return 0;
    }
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

static int
is_directed_automorphism(struct saucy *s)
{
    int i, j;

    for (i = 0; i < s->ndiffs; ++i) {
        j = s->unsupp[i];
        if (!check_mapping(s, s->adj, s->edg, j)) return 0;
        if (!check_mapping(s, s->dadj, s->dedg, j)) return 0;
    }
    return 1;
}